

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O0

void __thiscall QXcbWindow::updateWmTransientFor(QXcbWindow *this)

{
  bool bVar1;
  char *t;
  long lVar2;
  long *plVar3;
  QDebug *pQVar4;
  xcb_connection_t *pxVar5;
  long in_RDI;
  long in_FS_OFFSET;
  QXcbWindow *handle;
  QWindow *tp;
  xcb_window_t transientXcbParent;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff0c;
  QXcbWindow *in_stack_ffffffffffffff10;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char *in_stack_ffffffffffffff18;
  QMessageLogger *in_stack_ffffffffffffff20;
  QXcbWindow *in_stack_ffffffffffffff28;
  QMessageLogger *local_d0;
  char local_98 [64];
  QDebug in_stack_ffffffffffffffa8;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  undefined1 local_2c [4];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = (undefined1  [4])0x0;
  QPlatformWindow::window();
  bVar1 = isTransient((QWindow *)in_stack_ffffffffffffff10);
  if (bVar1) {
    QPlatformWindow::window();
    t = (char *)QWindow::transientParent();
    if ((t != (char *)0x0) && (lVar2 = QWindow::handle(), lVar2 != 0)) {
      lVar2 = QWindow::handle();
      if (lVar2 == 0) {
        local_d0 = (QMessageLogger *)0x0;
      }
      else {
        local_d0 = (QMessageLogger *)(lVar2 + -0x20);
      }
      plVar3 = (long *)QWindow::handle();
      local_2c = (undefined1  [4])(**(code **)(*plVar3 + 0x68))();
      if (local_2c != (undefined1  [4])0x0) {
        registerWmTransientForChild(in_stack_ffffffffffffff10,in_stack_ffffffffffffff28);
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        lcQpaXcbWindow();
        anon_unknown.dwarf_301cd0::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff10,
                   (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
          anon_unknown.dwarf_301cd0::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1e24d0);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (char *)0x1e24e9);
          QMessageLogger::debug();
          pQVar4 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff28,t);
          QDebug::QDebug(&local_50,pQVar4);
          in_stack_ffffffffffffff28 = (QXcbWindow *)0x0;
          if (local_d0 != (QMessageLogger *)0x0) {
            in_stack_ffffffffffffff28 = (QXcbWindow *)(local_d0 + 1);
          }
          in_stack_ffffffffffffff20 = local_d0;
          ::operator<<((QDebug *)&local_48,(QPlatformSurface *)&local_50);
          pQVar4 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff28,t);
          QDebug::QDebug(&local_40,pQVar4);
          ::operator<<((QDebug *)&local_38,(QPlatformSurface *)&local_40);
          QDebug::~QDebug(&local_38);
          QDebug::~QDebug(&local_40);
          QDebug::~QDebug(&local_48);
          QDebug::~QDebug(&local_50);
          QDebug::~QDebug((QDebug *)&stack0xffffffffffffffa8);
          local_10 = local_10 & 0xffffffffffffff00;
        }
      }
    }
    if (local_2c == (undefined1  [4])0x0) {
      QXcbObject::connection((QXcbObject *)(in_RDI + 0x10));
      local_2c = (undefined1  [4])
                 QXcbConnection::clientLeader((QXcbConnection *)in_stack_ffffffffffffffa8.stream);
    }
    if (local_2c != (undefined1  [4])0x0) {
      pxVar5 = QXcbObject::xcb_connection((QXcbObject *)0x1e2638);
      this_00 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)local_2c;
      uVar6 = 1;
      xcb_change_property(pxVar5,0,*(undefined4 *)(in_RDI + 0x40),0x44,0x21,0x20);
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      lcQpaXcbWindow();
      anon_unknown.dwarf_301cd0::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (this_00,(QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,uVar6));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_301cd0::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1e26c6);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(int)((ulong)this_00 >> 0x20)
                   ,(char *)CONCAT44(in_stack_ffffffffffffff0c,uVar6),(char *)0x1e26dc);
        QMessageLogger::debug
                  (local_98,"0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x",
                   (ulong)*(uint *)(in_RDI + 0x40),(ulong)(uint)local_2c);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
  }
  if (local_2c == (undefined1  [4])0x0) {
    pxVar5 = QXcbObject::xcb_connection((QXcbObject *)0x1e2724);
    xcb_delete_property(pxVar5,*(undefined4 *)(in_RDI + 0x40),0x44);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::updateWmTransientFor()
{
    xcb_window_t transientXcbParent = XCB_NONE;
    if (isTransient(window())) {
        QWindow *tp = window()->transientParent();
        if (tp && tp->handle()) {
            QXcbWindow *handle = static_cast<QXcbWindow *>(tp->handle());
            transientXcbParent = tp->handle()->winId();
            if (transientXcbParent) {
                handle->registerWmTransientForChild(this);
                qCDebug(lcQpaXcbWindow) << Q_FUNC_INFO << static_cast<QPlatformWindow *>(handle)
                    << " registerWmTransientForChild " << static_cast<QPlatformWindow *>(this);
            }
        }
        // Default to client leader if there is no transient parent, else modal dialogs can
        // be hidden by their parents.
        if (!transientXcbParent)
            transientXcbParent = connection()->clientLeader();
        if (transientXcbParent) { // ICCCM 4.1.2.6
            xcb_change_property(xcb_connection(), XCB_PROP_MODE_REPLACE, m_window,
                                XCB_ATOM_WM_TRANSIENT_FOR, XCB_ATOM_WINDOW, 32,
                                1, &transientXcbParent);
            qCDebug(lcQpaXcbWindow, "0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x", m_window, transientXcbParent);
        }
    }
    if (!transientXcbParent)
        xcb_delete_property(xcb_connection(), m_window, XCB_ATOM_WM_TRANSIENT_FOR);
}